

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opcodes.cpp
# Opt level: O3

void Opcodes::AAA(SFLAG_Register *sfr,GEN_Register *gr,RAM *mem,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *cmd)

{
  byte bVar1;
  bool bVar2;
  uint8_t uVar3;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char *__end;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"AL","");
  bVar1 = GEN_Register::getReg_8(gr,&local_70);
  bVar2 = true;
  if ((bVar1 & 0xe) < 10) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"AF","");
    bVar2 = SFLAG_Register::getFlag(sfr,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 == false) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"SF","");
    SFLAG_Register::setFlag(sfr,&local_b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    paVar5 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"AF","");
    SFLAG_Register::setFlag(sfr,&local_50,false);
    _Var4._M_p = local_50._M_dataplus._M_p;
  }
  else {
    paVar5 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"AL","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"AL","");
    uVar3 = GEN_Register::getReg_8(gr,&local_f0);
    GEN_Register::setReg_8(gr,&local_90,uVar3 + 6 & 0xf);
    _Var4._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      _Var4._M_p = local_90._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar5) {
    operator_delete(_Var4._M_p,paVar5->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Opcodes::AAA(SFLAG_Register &sfr, GEN_Register &gr, RAM &mem, std::vector<std::string> &cmd) {
    if (((gr.getReg_8("AL") & 0x0F) > 9) || (sfr.getFlag("AF") == 1)) {
        gr.setReg_8("AL", (gr.getReg_8("AL") + 6) & 0x0F);
    } else {
        sfr.setFlag("SF", 0);
        sfr.setFlag("AF", 0);
    }
}